

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::getsamplesizes(aalcalc *this)

{
  int iVar1;
  undefined8 in_RAX;
  mapped_type *pmVar2;
  byte bVar3;
  int i;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((this->alct_output_ == true) && (iVar1 = this->samplesize_, 1 < iVar1)) {
    for (bVar3 = 0; (2 << (bVar3 & 0x1f)) + -1 <= iVar1; bVar3 = bVar3 + 1) {
      uStack_38 = CONCAT44(1 << (bVar3 & 0x1f),(undefined4)uStack_38);
      pmVar2 = std::
               map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
               ::operator[](&this->vec_sample_aal_,(key_type *)((long)&uStack_38 + 4));
      std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
                (pmVar2,(long)this->max_summary_id_ + 1);
      iVar1 = this->samplesize_;
    }
  }
  pmVar2 = std::
           map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
           ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::resize
            (pmVar2,(long)this->max_summary_id_ + 1);
  return;
}

Assistant:

void aalcalc::getsamplesizes()
{
	// Sample size subsets are fixed and non-overlapping, increasing in size
	// by a factor of 2^n, where n = subset number,
	// i.e. for 10 samples, sets are (1), (2, 3), (4, 5, 6, 7)
	// for 20 samples, sets are (1), (2, 3), (4, 5, 6, 7),
	//                          (8, 9, 10, 11, 12, 13, 14, 15)
	if (alct_output_ && samplesize_ > 1) {
		int i = 0;
		while (((1 << i) + ((1 << i) - 1)) <= samplesize_) {
			vec_sample_aal_[1 << i].resize(max_summary_id_ + 1);
			i++;
		}
	}
	vec_sample_aal_[samplesize_].resize(max_summary_id_ + 1);
}